

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execAddqAn<(moira::Instr)121,(moira::Mode)1,(moira::Size)4>(Moira *this,u16 opcode)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 8;
  if ((opcode & 0xe00) != 0) {
    uVar2 = (uint)((byte)(opcode >> 9) & 7);
  }
  iVar1 = *(int *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  prefetch<4ul>(this);
  (*this->_vptr_Moira[0x19])(this,4);
  *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38) = iVar1 - uVar2;
  return;
}

Assistant:

void
Moira::execAddqAn(u16 opcode)
{
    i8  src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    if (src == 0) src = 8;
    u32 result = (I == ADDQ) ? readA(dst) + src : readA(dst) - src;
    prefetch<POLLIPL>();

    sync(4);
    writeA(dst, result);
}